

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall helics::FederateState::routeMessage(FederateState *this,ActionMessage *msg)

{
  action_t aVar1;
  string_view logMessageSource;
  string_view message;
  
  if (this->mParent != (CommonCore *)0x0) {
    aVar1 = msg->messageAction;
    if (aVar1 == cmd_time_request) {
      if (((this->requestingMode)._M_base._M_i & 1U) == 0) {
        logMessageSource._M_str = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
        logMessageSource._M_len = gHelicsEmptyStr_abi_cxx11_._M_string_length;
        message._M_str = "sending time request in invalid state";
        message._M_len = 0x25;
        logMessage(this,0,logMessageSource,message,false);
      }
      aVar1 = msg->messageAction;
    }
    if (aVar1 == cmd_time_grant) {
      LOCK();
      (this->requestingMode)._M_base._M_i = false;
      UNLOCK();
    }
    BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,msg);
    return;
  }
  addAction(this,msg);
  return;
}

Assistant:

void FederateState::routeMessage(ActionMessage&& msg)
{
    if (mParent != nullptr) {
        if (msg.action() == CMD_TIME_REQUEST && !requestingMode) {
            LOG_ERROR("sending time request in invalid state");
        }
        if (msg.action() == CMD_TIME_GRANT) {
            requestingMode.store(false);
        }
        mParent->addActionMessage(std::move(msg));
    } else {
        addAction(std::move(msg));
    }
}